

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall cmComputeComponentGraph::Tarjan(cmComputeComponentGraph *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer pcVar1;
  pointer pcVar2;
  size_t i;
  size_type __new_size;
  TarjanEntry entry;
  value_type_conflict2 local_50;
  value_type local_48;
  
  pcVar1 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = ((long)pcVar1 - (long)pcVar2 >> 3) * -0x5555555555555555;
  local_48.Root = 0;
  local_48.VisitIndex = 0;
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,0);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,__new_size,&local_48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->TarjanComponents,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->TarjanComponents,__new_size,&INVALID_COMPONENT);
  this->TarjanWalkId = 0;
  this_00 = &this->TarjanVisited;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,0);
  local_50 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,__new_size,&local_50);
  if (pcVar1 != pcVar2) {
    i = 0;
    do {
      if ((this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[i] == 0) {
        if ((this->TarjanStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->TarjanStack).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur) {
          __assert_fail("this->TarjanStack.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmComputeComponentGraph.cxx"
                        ,0x2d,"void cmComputeComponentGraph::Tarjan()");
        }
        this->TarjanWalkId = this->TarjanWalkId + 1;
        this->TarjanIndex = 0;
        TarjanVisit(this,i);
      }
      i = i + 1;
    } while (__new_size + (__new_size == 0) != i);
  }
  return;
}

Assistant:

void cmComputeComponentGraph::Tarjan()
{
  size_t n = this->InputGraph.size();
  TarjanEntry entry = { 0, 0 };
  this->TarjanEntries.resize(0);
  this->TarjanEntries.resize(n, entry);
  this->TarjanComponents.resize(0);
  this->TarjanComponents.resize(n, INVALID_COMPONENT);
  this->TarjanWalkId = 0;
  this->TarjanVisited.resize(0);
  this->TarjanVisited.resize(n, 0);
  for (size_t i = 0; i < n; ++i) {
    // Start a new DFS from this node if it has never been visited.
    if (!this->TarjanVisited[i]) {
      assert(this->TarjanStack.empty());
      ++this->TarjanWalkId;
      this->TarjanIndex = 0;
      this->TarjanVisit(i);
    }
  }
}